

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void __thiscall
FRemapTable::AddDesaturation
          (FRemapTable *this,int start,int end,double r1,double g1,double b1,double r2,double g2,
          double b2)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  uint uVar4;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 pe;
  long lVar5;
  uint uVar6;
  double dVar7;
  uint uVar8;
  uint uVar9;
  uint uVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  
  auVar10._8_8_ = r1;
  auVar10._0_8_ = g1;
  if (2.0 <= b1) {
    b1 = 2.0;
  }
  if (b1 <= 0.0) {
    b1 = 0.0;
  }
  auVar16._8_8_ = r2;
  auVar16._0_8_ = g2;
  auVar10 = minpd(auVar10,_DAT_005b0210);
  auVar11 = maxpd(auVar10,ZEXT816(0));
  auVar10 = minpd(auVar16,_DAT_005b0210);
  auVar10 = maxpd(auVar10,ZEXT816(0));
  if (2.0 <= b2) {
    b2 = 2.0;
  }
  if (b2 <= 0.0) {
    b2 = 0.0;
  }
  dVar14 = auVar11._0_8_;
  dVar15 = auVar11._8_8_;
  dVar13 = b1;
  iVar3 = start;
  if (start <= end) {
    dVar14 = auVar10._0_8_;
    dVar15 = auVar10._8_8_;
    auVar10 = auVar11;
    dVar13 = b2;
    iVar3 = end;
    b2 = b1;
  }
  if (end < start) {
    start = end;
  }
  for (lVar5 = (long)start; lVar5 <= iVar3; lVar5 = lVar5 + 1) {
    dVar7 = (double)((uint)GPalette.BaseColors[lVar5].field_0.field_0.b * 0x25 +
                    (uint)GPalette.BaseColors[lVar5].field_0.field_0.g * 0x8f +
                    (uint)GPalette.BaseColors[lVar5].field_0.field_0.r * 0x4d) * 0.00390625;
    uVar4 = (uint)(dVar7 * (dVar13 - b2) + b2 * 255.0);
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    bVar1 = GPalette.Remap[lVar5];
    uVar6 = (uint)(dVar7 * (dVar14 - auVar10._0_8_) + auVar10._0_8_ * 255.0);
    uVar8 = (uint)(dVar7 * (dVar15 - auVar10._8_8_) + auVar10._8_8_ * 255.0);
    uVar9 = -(uint)((int)uVar6 < 0xff);
    uVar12 = -(uint)((int)uVar8 < 0xff);
    pe = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
         ((~uVar12 & 0xff | uVar8 & uVar12 & 0xff) << 0x10 |
         (~uVar9 & 0xff | uVar6 & uVar9 & 0xff) << 8 | uVar4 & 0xff);
    BVar2 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)pe);
    this->Remap[bVar1] = BVar2;
    ((anon_union_4_2_12391d7c_for_PalEntry_0 *)
    ((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4)))->field_0 = pe;
    *(char *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4) + 3) = -(bVar1 != 0);
  }
  return;
}

Assistant:

void FRemapTable::AddDesaturation(int start, int end, double r1, double g1, double b1, double r2, double g2, double b2)
{
	r1 = clamp(r1, 0.0, 2.0);
	g1 = clamp(g1, 0.0, 2.0);
	b1 = clamp(b1, 0.0, 2.0);
	r2 = clamp(r2, 0.0, 2.0);
	g2 = clamp(g2, 0.0, 2.0);
	b2 = clamp(b2, 0.0, 2.0);

	if (start > end)
	{
		swapvalues(start, end);
		swapvalues(r1, r2);
		swapvalues(g1, g2);
		swapvalues(b1, b2);
	}

	r2 -= r1;
	g2 -= g1;
	b2 -= b1;
	r1 *= 255;
	g1 *= 255;
	b1 *= 255;

	for(int c = start; c <= end; c++)
	{
		double intensity = (GPalette.BaseColors[c].r * 77 +
							GPalette.BaseColors[c].g * 143 +
							GPalette.BaseColors[c].b * 37) / 256.0;

		PalEntry pe = PalEntry(	MIN(255, int(r1 + intensity*r2)), 
								MIN(255, int(g1 + intensity*g2)), 
								MIN(255, int(b1 + intensity*b2)));

		int cc = GPalette.Remap[c];

		Remap[cc] = ColorMatcher.Pick(pe);
		Palette[cc] = pe;
		Palette[cc].a = cc == 0 ? 0:255;
	}
}